

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parser_destroy(parser *p)

{
  parser_hook *ppVar1;
  parser_hook *h;
  
  parser_freeold(p);
  h = p->hooks;
  while (h != (parser_hook *)0x0) {
    ppVar1 = h->next;
    clean_specs(h);
    mem_free(p->hooks);
    p->hooks = ppVar1;
    h = ppVar1;
  }
  mem_free(p);
  return;
}

Assistant:

void parser_destroy(struct parser *p) {
	struct parser_hook *h;
	parser_freeold(p);
	while (p->hooks) {
		h = p->hooks->next;
		clean_specs(p->hooks);
		mem_free(p->hooks);
		p->hooks = h;
	}
	mem_free(p);
}